

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O0

void bandit::use_default_formatters(choice_options *choices)

{
  option_map *this;
  anon_class_1_0_00000001 local_b9;
  controller_func_t local_b8;
  allocator local_91;
  string local_90;
  anon_class_1_0_00000001 local_69;
  controller_func_t local_68;
  allocator local_31;
  string local_30;
  choice_options *local_10;
  choice_options *choices_local;
  
  local_10 = choices;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"vs",&local_31);
  std::function<void(bandit::detail::controller_t&)>::
  function<bandit::use_default_formatters(bandit::detail::choice_options&)::_lambda(bandit::detail::controller_t&)_1_,void>
            ((function<void(bandit::detail::controller_t&)> *)&local_68,&local_69);
  detail::option_map::add(&choices->formatters,&local_30,&local_68,false);
  std::function<void_(bandit::detail::controller_t_&)>::~function(&local_68);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  this = &local_10->formatters;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"posix",&local_91);
  std::function<void(bandit::detail::controller_t&)>::
  function<bandit::use_default_formatters(bandit::detail::choice_options&)::_lambda(bandit::detail::controller_t&)_2_,void>
            ((function<void(bandit::detail::controller_t&)> *)&local_b8,&local_b9);
  detail::option_map::add(this,&local_90,&local_b8,true);
  std::function<void_(bandit::detail::controller_t_&)>::~function(&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return;
}

Assistant:

inline void use_default_formatters(detail::choice_options& choices) {
    choices.formatters.add("vs", [&](detail::controller_t& controller) {
      controller.set_formatter(new failure_formatter::visual_studio());
    });
    choices.formatters.add("posix", [&](detail::controller_t& controller) {
      controller.set_formatter(new failure_formatter::posix());
    }, true);
  }